

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::RegisterGenerator
          (CommandLineInterface *this,string *flag_name,string *option_flag_name,
          CodeGenerator *generator,string *help_text)

{
  mapped_type *this_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>
  this_01;
  undefined1 local_98 [8];
  GeneratorInfo info;
  string *help_text_local;
  CodeGenerator *generator_local;
  string *option_flag_name_local;
  string *flag_name_local;
  CommandLineInterface *this_local;
  
  info.help_text.field_2._8_8_ = help_text;
  GeneratorInfo::GeneratorInfo((GeneratorInfo *)local_98);
  std::__cxx11::string::operator=((string *)local_98,(string *)flag_name);
  std::__cxx11::string::operator=
            ((string *)(info.flag_name.field_2._M_local_buf + 8),(string *)option_flag_name);
  info.option_flag_name.field_2._8_8_ = generator;
  std::__cxx11::string::operator=((string *)&info.generator,(string *)info.help_text.field_2._8_8_);
  this_00 = absl::lts_20250127::container_internal::
            btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
            ::operator[]<std::__cxx11::string>
                      ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
                        *)&this->generators_by_flag_name_,flag_name);
  GeneratorInfo::operator=(this_00,(GeneratorInfo *)local_98);
  this_01 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
            ::
            operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
                        *)&this->generators_by_option_name_,option_flag_name);
  GeneratorInfo::operator=(this_01,(GeneratorInfo *)local_98);
  GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_98);
  return;
}

Assistant:

void CommandLineInterface::RegisterGenerator(
    const std::string& flag_name, const std::string& option_flag_name,
    CodeGenerator* generator, const std::string& help_text) {
  GeneratorInfo info;
  info.flag_name = flag_name;
  info.option_flag_name = option_flag_name;
  info.generator = generator;
  info.help_text = help_text;
  generators_by_flag_name_[flag_name] = info;
  generators_by_option_name_[option_flag_name] = info;
}